

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11VulkanPlatform.cpp
# Opt level: O3

void __thiscall
tcu::x11::VulkanPlatform::getMemoryLimits(VulkanPlatform *this,PlatformMemoryLimits *limits)

{
  *(undefined8 *)limits = 0x10000000;
  *(undefined8 *)(limits + 8) = 0x8000000;
  *(undefined8 *)(limits + 0x10) = 0x10000;
  *(undefined8 *)(limits + 0x18) = 0x1000;
  *(undefined8 *)(limits + 0x20) = 8;
  *(undefined8 *)(limits + 0x28) = 3;
  return;
}

Assistant:

void VulkanPlatform::getMemoryLimits (vk::PlatformMemoryLimits& limits) const
{
	limits.totalSystemMemory					= 256*1024*1024;
	limits.totalDeviceLocalMemory				= 128*1024*1024;
	limits.deviceMemoryAllocationGranularity	= 64*1024;
	limits.devicePageSize						= 4096;
	limits.devicePageTableEntrySize				= 8;
	limits.devicePageTableHierarchyLevels		= 3;
}